

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclientconnector.hpp
# Opt level: O2

string * __thiscall
TestClientConnector::Send(string *__return_storage_ptr__,TestClientConnector *this,string *r)

{
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  bStack_48;
  _Any_data local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string_const&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&bStack_48,r,(parser_callback_t *)&local_38,true,false);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::operator=(&this->request,&bStack_48);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&bStack_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->raw_response);
  return __return_storage_ptr__;
}

Assistant:

std::string Send(const std::string &r) override {
    this->request = json::parse(r);
    return raw_response;
  }